

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void InterpolateRow_16_C(uint16_t *dst_ptr,uint16_t *src_ptr,ptrdiff_t src_stride,int width,
                        int source_y_fraction)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int y1_fraction;
  
  if (source_y_fraction == 0) {
    memcpy(dst_ptr,src_ptr,(long)(width * 2));
    return;
  }
  if (source_y_fraction == 0x80) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)width;
    if (width < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      dst_ptr[uVar2] = (uint16_t)((uint)src_ptr[uVar2] + (uint)src_ptr[src_stride + uVar2] + 1 >> 1)
      ;
    }
  }
  else {
    iVar1 = 0x100 - source_y_fraction;
    for (lVar4 = 0; (int)lVar4 < width + -1; lVar4 = lVar4 + 2) {
      dst_ptr[lVar4] =
           (uint16_t)
           ((uint)src_ptr[src_stride + lVar4] * source_y_fraction + (uint)src_ptr[lVar4] * iVar1 >>
           8);
      dst_ptr[lVar4 + 1] =
           (uint16_t)
           ((uint)src_ptr[src_stride + lVar4 + 1] * source_y_fraction +
            (uint)src_ptr[lVar4 + 1] * iVar1 >> 8);
    }
    if ((width & 1U) != 0) {
      dst_ptr[lVar4] =
           (uint16_t)
           ((uint)src_ptr[src_stride + lVar4] * source_y_fraction + iVar1 * (uint)src_ptr[lVar4] >>
           8);
    }
  }
  return;
}

Assistant:

void InterpolateRow_16_C(uint16_t* dst_ptr,
                         const uint16_t* src_ptr,
                         ptrdiff_t src_stride,
                         int width,
                         int source_y_fraction) {
  int y1_fraction = source_y_fraction;
  int y0_fraction = 256 - y1_fraction;
  const uint16_t* src_ptr1 = src_ptr + src_stride;
  int x;
  if (source_y_fraction == 0) {
    memcpy(dst_ptr, src_ptr, width * 2);
    return;
  }
  if (source_y_fraction == 128) {
    HalfRow_16_C(src_ptr, src_stride, dst_ptr, width);
    return;
  }
  for (x = 0; x < width - 1; x += 2) {
    dst_ptr[0] = (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction) >> 8;
    dst_ptr[1] = (src_ptr[1] * y0_fraction + src_ptr1[1] * y1_fraction) >> 8;
    src_ptr += 2;
    src_ptr1 += 2;
    dst_ptr += 2;
  }
  if (width & 1) {
    dst_ptr[0] = (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction) >> 8;
  }
}